

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::Clog2Function::checkArguments
          (Clog2Function *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  Type *pTVar3;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,1,1);
  if (bVar2) {
    bVar2 = Type::isIntegral(((*args->_M_ptr)->type).ptr);
    if (!bVar2) {
      pTVar3 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,*args->_M_ptr);
      return pTVar3;
    }
    pTVar3 = pCVar1->integerType;
  }
  else {
    pTVar3 = pCVar1->errorType;
  }
  return pTVar3;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 1))
            return comp.getErrorType();

        if (!args[0]->type->isIntegral())
            return badArg(context, *args[0]);

        return comp.getIntegerType();
    }